

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

char * nullcDebugGetVmAddressLocation(uint instruction,uint full)

{
  char *pcVar1;
  bool bVar2;
  int iStack_300;
  int codeLength;
  char *codeEnd;
  uint line;
  uint column;
  char *codeStart;
  ExternLocalInfo *local_2e0;
  ExternLocalInfo *lInfo;
  ExternLocalInfo *pEStack_2d0;
  uint i;
  ExternLocalInfo *exLocals;
  ExternTypeInfo *pEStack_2c0;
  uint exLocalsSize;
  ExternTypeInfo *exTypes;
  ExternFuncInfo *pEStack_2b0;
  uint exTypesSize;
  ExternFuncInfo *targetFunction;
  char *pcStack_2a0;
  uint moduleIndex;
  char *sourceLocation;
  ExternModuleInfo *modules;
  char *pcStack_288;
  uint moduleCount;
  char *fullSource;
  char *symbols;
  ExternFuncInfo *local_268;
  ExternFuncInfo *functions;
  undefined1 local_258 [4];
  uint functionCount;
  OutputContext output;
  uint full_local;
  uint instruction_local;
  
  nullcDebugGetVmAddressLocation::buffer.pos = 0;
  output.closeStream._0_4_ = full;
  output.closeStream._4_4_ = instruction;
  OutputContext::OutputContext((OutputContext *)local_258);
  output._536_8_ = &nullcDebugGetVmAddressLocation::buffer;
  output.openStream = anon_unknown.dwarf_10ab1c::BufferWriteStream;
  functions._4_4_ = 0;
  local_268 = nullcDebugFunctionInfo((uint *)((long)&functions + 4));
  fullSource = nullcDebugSymbols((uint *)0x0);
  pcStack_288 = nullcDebugSource();
  modules._4_4_ = 0;
  sourceLocation = (char *)nullcDebugModuleInfo((uint *)((long)&modules + 4));
  pcStack_2a0 = nullcDebugGetInstructionSourceLocation(output.closeStream._4_4_);
  targetFunction._4_4_ = nullcDebugGetSourceLocationModuleIndex(pcStack_2a0);
  if ((uint)output.closeStream != 0) {
    if (targetFunction._4_4_ < modules._4_4_) {
      OutputContext::Printf
                ((OutputContext *)local_258,"{%s} ",
                 fullSource + *(uint *)(sourceLocation + (ulong)targetFunction._4_4_ * 0x1c + 4));
    }
    else {
      OutputContext::Printf((OutputContext *)local_258,"{root} ");
    }
  }
  pEStack_2b0 = nullcDebugConvertAddressToFunction
                          (output.closeStream._4_4_,local_268,functions._4_4_);
  if (pEStack_2b0 == (ExternFuncInfo *)0x0) {
    OutputContext::Print((OutputContext *)local_258,"nullcGlobal()");
  }
  else {
    OutputContext::Printf((OutputContext *)local_258,"%s(",fullSource + pEStack_2b0->offsetToName);
    exTypes._4_4_ = 0;
    pEStack_2c0 = nullcDebugTypeInfo((uint *)((long)&exTypes + 4));
    exLocals._4_4_ = 0;
    pEStack_2d0 = nullcDebugLocalInfo((uint *)((long)&exLocals + 4));
    for (lInfo._4_4_ = 0; lInfo._4_4_ < pEStack_2b0->paramCount; lInfo._4_4_ = lInfo._4_4_ + 1) {
      local_2e0 = pEStack_2d0 + (pEStack_2b0->offsetToFirstLocal + lInfo._4_4_);
      if (local_2e0->paramType == '\0') {
        pcVar1 = "";
        if (lInfo._4_4_ != 0) {
          pcVar1 = ", ";
        }
        OutputContext::Printf
                  ((OutputContext *)local_258,"%s%s %s",pcVar1,
                   fullSource + pEStack_2c0[local_2e0->type].offsetToName,
                   fullSource + local_2e0->offsetToName);
      }
    }
    OutputContext::Print((OutputContext *)local_258,")");
  }
  if (pcStack_2a0 == (char *)0x0) {
    OutputContext::Flush((OutputContext *)local_258);
    nullcDebugGetVmAddressLocation::buffer.buf[nullcDebugGetVmAddressLocation::buffer.pos] = '\0';
  }
  else {
    _line = pcStack_2a0;
    codeEnd._4_4_ = 0;
    codeEnd._0_4_ =
         nullcDebugGetSourceLocationLineAndColumn
                   (pcStack_2a0,targetFunction._4_4_,(uint *)((long)&codeEnd + 4));
    if ((uint)output.closeStream == 0) {
      OutputContext::Printf((OutputContext *)local_258," Line %d",(ulong)((uint)codeEnd + 1));
    }
    else {
      while( true ) {
        bVar2 = false;
        if (_line != pcStack_288) {
          bVar2 = _line[-1] != '\n';
        }
        if (!bVar2) break;
        _line = _line + -1;
      }
      while( true ) {
        bVar2 = true;
        if (*_line != ' ') {
          bVar2 = *_line == '\t';
        }
        if (!bVar2) break;
        _line = _line + 1;
      }
      _iStack_300 = _line;
      while( true ) {
        bVar2 = false;
        if ((*_iStack_300 != '\0') && (bVar2 = false, *_iStack_300 != '\r')) {
          bVar2 = *_iStack_300 != '\n';
        }
        if (!bVar2) break;
        _iStack_300 = _iStack_300 + 1;
      }
      OutputContext::Printf
                ((OutputContext *)local_258," Line %d at \'%.*s\'",(ulong)((uint)codeEnd + 1),
                 (ulong)(iStack_300 - line),_line);
    }
    OutputContext::Flush((OutputContext *)local_258);
    nullcDebugGetVmAddressLocation::buffer.buf[nullcDebugGetVmAddressLocation::buffer.pos] = '\0';
  }
  output.tempBufSize = 0;
  output._540_4_ = 0;
  codeStart._4_4_ = 1;
  OutputContext::~OutputContext((OutputContext *)local_258);
  return nullcDebugGetVmAddressLocation::buffer.buf;
}

Assistant:

const char* nullcDebugGetVmAddressLocation(unsigned instruction, unsigned full)
{
	using namespace NULLC;

	static OutputBuffer buffer;

	// Reset position
	buffer.pos = 0;

	OutputContext output;

	output.stream = &buffer;
	output.writeStream = BufferWriteStream;

	unsigned functionCount = 0;
	ExternFuncInfo *functions = nullcDebugFunctionInfo(&functionCount);

	char *symbols = nullcDebugSymbols(NULL);

	char *fullSource = nullcDebugSource();

	unsigned moduleCount = 0;
	ExternModuleInfo *modules = nullcDebugModuleInfo(&moduleCount);

	const char *sourceLocation = nullcDebugGetInstructionSourceLocation(instruction);

	unsigned moduleIndex = nullcDebugGetSourceLocationModuleIndex(sourceLocation);

	if(full)
	{
		if(moduleIndex < moduleCount)
			output.Printf("{%s} ", symbols + modules[moduleIndex].nameOffset);
		else
			output.Printf("{root} ");
	}

	ExternFuncInfo *targetFunction = nullcDebugConvertAddressToFunction(instruction, functions, functionCount);

	if(targetFunction)
	{
		output.Printf("%s(", symbols + targetFunction->offsetToName);

		unsigned exTypesSize = 0;
		ExternTypeInfo *exTypes = nullcDebugTypeInfo(&exTypesSize);

		unsigned exLocalsSize = 0;
		ExternLocalInfo *exLocals = nullcDebugLocalInfo(&exLocalsSize);

		for(unsigned i = 0; i < targetFunction->paramCount; i++)
		{
			ExternLocalInfo &lInfo = exLocals[targetFunction->offsetToFirstLocal + i];

			if(lInfo.paramType != ExternLocalInfo::PARAMETER)
				continue;

			output.Printf("%s%s %s", i != 0 ? ", " : "", symbols + exTypes[lInfo.type].offsetToName, symbols + lInfo.offsetToName);
		}

		output.Print(")");
	}
	else
	{
		output.Print("nullcGlobal()");
	}

	// Stop if source location is missing
	if(!sourceLocation)
	{
		output.Flush();
		output.stream = NULL;
		buffer.buf[buffer.pos] = 0;

		return buffer.buf;
	}

	const char *codeStart = sourceLocation;

	unsigned column = 0;
	unsigned line = nullcDebugGetSourceLocationLineAndColumn(codeStart, moduleIndex, column);

	if(full)
	{
		// Find beginning of the line
		while(codeStart != fullSource && *(codeStart - 1) != '\n')
			codeStart--;

		// Skip whitespace
		while(*codeStart == ' ' || *codeStart == '\t')
			codeStart++;

		const char *codeEnd = codeStart;

		// Find ending of the line
		while(*codeEnd != '\0' && *codeEnd != '\r' && *codeEnd != '\n')
			codeEnd++;

		int codeLength = int(codeEnd - codeStart);
		output.Printf(" Line %d at '%.*s'", line + 1, codeLength, codeStart);
	}
	else
	{
		output.Printf(" Line %d", line + 1);
	}

	output.Flush();
	output.stream = NULL;
	buffer.buf[buffer.pos] = 0;

	return buffer.buf;
}